

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Approvals.h
# Opt level: O2

void ApprovalTests::
     TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>>::
     verify<StringMakerPrintable,int>(StringMakerPrintable *contents,Options *options)

{
  uchar *in_RCX;
  size_t siglen;
  size_t in_R8;
  string local_30;
  
  StringMaker::toString<StringMakerPrintable>(&local_30,contents);
  TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>_>::verify
            ((EVP_PKEY_CTX *)&local_30,(uchar *)options,siglen,in_RCX,in_R8);
  ::std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

static void verify(const T& contents, const Options& options = Options())
        {
            verify(TCompileTimeOptions::ToStringConverter::toString(contents), options);
        }